

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O1

_Bool container_iterator_read_into_uint32
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,uint32_t high16,
                uint32_t *buf,uint32_t count,uint32_t *consumed,uint16_t *value_out)

{
  ushort uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  _Bool _Var5;
  uint uVar6;
  ulong *puVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  long lVar18;
  
  *consumed = 0;
  auVar4 = _DAT_0013e2e0;
  auVar3 = _DAT_0013e2d0;
  if (count == 0) {
    return false;
  }
  if (typecode == '\x01') {
    iVar9 = it->index;
    iVar13 = iVar9 + 0x3f;
    if (-1 < iVar9) {
      iVar13 = iVar9;
    }
    uVar11 = (ulong)(uint)(iVar13 >> 6);
    lVar2 = *(long *)((long)c + 8);
    uVar12 = (*(ulong *)(lVar2 + uVar11 * 8) >> ((byte)iVar9 & 0x3f)) << ((byte)iVar9 & 0x3f);
    do {
      if (uVar12 != 0) {
        do {
          if (count <= *consumed) break;
          lVar14 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          *buf = (uint)lVar14 | (int)uVar11 << 6 | high16;
          buf = buf + 1;
          *consumed = *consumed + 1;
          uVar12 = uVar12 & uVar12 - 1;
        } while (uVar12 != 0);
      }
      if ((uVar12 == 0) && (uVar8 = (int)uVar11 + 1, uVar8 < 0x400)) {
        puVar7 = (ulong *)(lVar2 + (ulong)uVar8 * 8);
        do {
          uVar8 = (int)uVar11 + 1;
          uVar11 = (ulong)uVar8;
          uVar12 = *puVar7;
          if (uVar12 != 0) break;
          puVar7 = puVar7 + 1;
        } while (uVar8 < 0x3ff);
      }
      if (uVar12 == 0) {
        return uVar12 != 0;
      }
    } while (*consumed < count);
    lVar2 = 0;
    if (uVar12 != 0) {
      for (; (uVar12 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    uVar8 = (uint)lVar2 | (int)uVar11 << 6;
    it->index = uVar8;
  }
  else {
    if (typecode != '\x02') {
      lVar2 = *(long *)((long)c + 8);
      uVar8 = (uint)*value_out;
      while( true ) {
        uVar10 = (uint)*(ushort *)(lVar2 + 2 + (long)it->index * 4) +
                 (uint)*(ushort *)(lVar2 + (long)it->index * 4);
        uVar8 = uVar8 & 0xffff;
        uVar15 = (uVar10 - uVar8) + 1;
        uVar6 = count - *consumed;
        if (uVar15 < count - *consumed) {
          uVar6 = uVar15;
        }
        uVar12 = (ulong)uVar6;
        if (uVar6 != 0) {
          lVar14 = uVar12 - 1;
          auVar16._8_4_ = (int)lVar14;
          auVar16._0_8_ = lVar14;
          auVar16._12_4_ = (int)((ulong)lVar14 >> 0x20);
          lVar14 = 1;
          auVar16 = auVar16 ^ auVar4;
          auVar17 = auVar3;
          uVar15 = uVar8;
          do {
            auVar19 = auVar17 ^ auVar4;
            if ((bool)(~(auVar16._4_4_ < auVar19._4_4_ ||
                        auVar16._0_4_ < auVar19._0_4_ && auVar19._4_4_ == auVar16._4_4_) & 1)) {
              buf[lVar14 + -1] = uVar15 | high16;
            }
            if (auVar19._12_4_ <= auVar16._12_4_ &&
                (auVar19._8_4_ <= auVar16._8_4_ || auVar19._12_4_ != auVar16._12_4_)) {
              buf[lVar14] = uVar15 + 1 | high16;
            }
            lVar18 = auVar17._8_8_;
            auVar17._0_8_ = auVar17._0_8_ + 2;
            auVar17._8_8_ = lVar18 + 2;
            lVar18 = lVar14 - (uVar12 + 1 & 0xfffffffffffffffe);
            lVar14 = lVar14 + 2;
            uVar15 = uVar15 + 2;
          } while (lVar18 != -1);
        }
        uVar8 = uVar8 + uVar6;
        *value_out = (uint16_t)uVar8;
        *consumed = *consumed + uVar6;
        _Var5 = true;
        if (((uint16_t)uVar8 == 0) || (uVar10 < (uVar8 & 0xffff))) {
          iVar9 = it->index;
          iVar13 = iVar9 + 1;
          it->index = iVar13;
          if (iVar13 < *c) {
            uVar1 = *(ushort *)(lVar2 + 4 + (long)iVar9 * 4);
            uVar8 = (uint)uVar1;
            *value_out = uVar1;
          }
          else {
            _Var5 = false;
          }
        }
        if (_Var5 == false) break;
        buf = buf + uVar12;
        if (count <= *consumed) {
          return _Var5;
        }
      }
      return false;
    }
    uVar8 = *c - it->index;
    if (count <= uVar8) {
      uVar8 = count;
    }
    if (*c != it->index) {
      lVar2 = *(long *)((long)c + 8);
      uVar12 = 0;
      do {
        buf[uVar12] = *(ushort *)(lVar2 + (ulong)(uint)(it->index + (int)uVar12) * 2) | high16;
        uVar12 = uVar12 + 1;
      } while (uVar8 + (uVar8 == 0) != uVar12);
    }
    *consumed = *consumed + uVar8;
    iVar9 = uVar8 + it->index;
    it->index = iVar9;
    if (*c <= iVar9) {
      return iVar9 < *c;
    }
    uVar8 = (uint)*(ushort *)(*(long *)((long)c + 8) + (long)iVar9 * 2);
  }
  *value_out = (uint16_t)uVar8;
  return true;
}

Assistant:

bool container_iterator_read_into_uint32(const container_t *c, uint8_t typecode,
                                         roaring_container_iterator_t *it,
                                         uint32_t high16, uint32_t *buf,
                                         uint32_t count, uint32_t *consumed,
                                         uint16_t *value_out) {
    *consumed = 0;
    if (count == 0) {
        return false;
    }
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(c);
            uint32_t wordindex = it->index / 64;
            uint64_t word =
                bc->words[wordindex] & (UINT64_MAX << (it->index % 64));
            do {
                // Read set bits.
                while (word != 0 && *consumed < count) {
                    *buf = high16 |
                           (wordindex * 64 + roaring_trailing_zeroes(word));
                    word = word & (word - 1);
                    buf++;
                    (*consumed)++;
                }
                // Skip unset bits.
                while (word == 0 &&
                       wordindex + 1 < BITSET_CONTAINER_SIZE_IN_WORDS) {
                    wordindex++;
                    word = bc->words[wordindex];
                }
            } while (word != 0 && *consumed < count);

            if (word != 0) {
                it->index = wordindex * 64 + roaring_trailing_zeroes(word);
                *value_out = it->index;
                return true;
            }
            return false;
        }
        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(c);
            uint32_t num_values =
                minimum_uint32(ac->cardinality - it->index, count);
            for (uint32_t i = 0; i < num_values; i++) {
                buf[i] = high16 | ac->array[it->index + i];
            }
            *consumed += num_values;
            it->index += num_values;
            if (it->index < ac->cardinality) {
                *value_out = ac->array[it->index];
                return true;
            }
            return false;
        }
        case RUN_CONTAINER_TYPE: {
            const run_container_t *rc = const_CAST_run(c);
            do {
                uint32_t largest_run_value =
                    rc->runs[it->index].value + rc->runs[it->index].length;
                uint32_t num_values = minimum_uint32(
                    largest_run_value - *value_out + 1, count - *consumed);
                for (uint32_t i = 0; i < num_values; i++) {
                    buf[i] = high16 | (*value_out + i);
                }
                *value_out += num_values;
                buf += num_values;
                *consumed += num_values;

                // We check for `value == 0` because `it->value += num_values`
                // can overflow when `value == UINT16_MAX`, and `count >
                // length`. In this case `value` will overflow to 0.
                if (*value_out > largest_run_value || *value_out == 0) {
                    it->index++;
                    if (it->index < rc->n_runs) {
                        *value_out = rc->runs[it->index].value;
                    } else {
                        return false;
                    }
                }
            } while (*consumed < count);
            return true;
        }
        default:
            assert(false);
            roaring_unreachable;
            return 0;
    }
}